

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

END_HANDLE end_create(void)

{
  END_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (END_HANDLE)malloc(8);
  if (__ptr != (END_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x17);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (END_HANDLE)0x0;
}

Assistant:

END_HANDLE end_create(void)
{
    END_INSTANCE* end_instance = (END_INSTANCE*)malloc(sizeof(END_INSTANCE));
    if (end_instance != NULL)
    {
        end_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(23);
        if (end_instance->composite_value == NULL)
        {
            free(end_instance);
            end_instance = NULL;
        }
    }

    return end_instance;
}